

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::GenerateBooleanNegate(Lowerer *this,Instr *instr,Opnd *srcBool,Opnd *dst)

{
  ScriptContextInfo *pSVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  AddrOpnd *src2;
  
  InsertMove(dst,srcBool,instr,true);
  pSVar1 = instr->m_func->m_scriptContextInfo;
  iVar2 = (*pSVar1->_vptr_ScriptContextInfo[2])(pSVar1);
  iVar3 = (*pSVar1->_vptr_ScriptContextInfo[3])(pSVar1);
  src2 = IR::AddrOpnd::New(CONCAT44(extraout_var,iVar2) ^ CONCAT44(extraout_var_00,iVar3),
                           AddrOpndKindDynamicMisc,instr->m_func,true,(Var)0x0);
  InsertXor(dst,dst,&src2->super_Opnd,instr);
  return;
}

Assistant:

void Lowerer::GenerateBooleanNegate(IR::Instr * instr, IR::Opnd * srcBool, IR::Opnd * dst)
{
    // dst = src
    // dst = dst ^ (true ^ false) (= !src)
    Lowerer::InsertMove(dst, srcBool, instr);
    ScriptContextInfo* sci = instr->m_func->GetScriptContextInfo();
    IR::AddrOpnd* xorval = IR::AddrOpnd::New(sci->GetTrueAddr() ^ sci->GetFalseAddr(), IR::AddrOpndKindDynamicMisc, instr->m_func, true);
    InsertXor(dst, dst, xorval, instr);
}